

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise1d.cpp
# Opt level: O1

int ncnn::deconvolutiondepthwise1d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int stride_w,int dilation_w,int group,int activation_type,Mat *activation_params,
              Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  float *pfVar14;
  void *pvVar15;
  float *pfVar16;
  ulong uVar17;
  float *pfVar18;
  void *pvVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  float *pfVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar30;
  undefined1 auVar29 [16];
  float fVar31;
  int iVar32;
  int iVar34;
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int size_1;
  int size;
  ulong local_148;
  ulong local_118;
  ulong local_110;
  void *local_c8;
  undefined8 uStack_c0;
  float *local_a0;
  float *local_98;
  
  uVar2 = bottom_blob->w;
  uVar9 = bottom_blob->h;
  local_110 = (ulong)uVar9;
  uVar3 = top_blob->w;
  if (bias_data->data == (void *)0x0) {
    bVar24 = true;
  }
  else {
    bVar24 = (long)bias_data->c * bias_data->cstep == 0;
  }
  if (top_blob->h == group && uVar9 == group) {
    if (0 < group) {
      uVar9 = top_blob->w;
      pfVar18 = (float *)top_blob->data;
      iVar10 = bottom_blob->w;
      sVar5 = bottom_blob->elemsize;
      pvVar6 = bottom_blob->data;
      pvVar15 = weight_data->data;
      pvVar7 = bias_data->data;
      lVar11 = (ulong)uVar9 - 1;
      auVar33._8_4_ = (int)lVar11;
      auVar33._0_8_ = lVar11;
      auVar33._12_4_ = (int)((ulong)lVar11 >> 0x20);
      local_110 = (long)(int)uVar9 * top_blob->elemsize;
      pfVar23 = pfVar18 + 3;
      local_148 = 0;
      auVar33 = auVar33 ^ _DAT_005ef050;
      auVar35 = _DAT_005f2a10;
      auVar36 = _DAT_005ef040;
      auVar37 = _DAT_005ef050;
      do {
        fVar26 = 0.0;
        if (!bVar24) {
          fVar26 = *(float *)((long)pvVar7 + local_148 * 4);
        }
        if (0 < (int)uVar9) {
          uVar12 = 0;
          do {
            auVar27._8_4_ = (int)uVar12;
            auVar27._0_8_ = uVar12;
            auVar27._12_4_ = (int)(uVar12 >> 0x20);
            auVar29 = (auVar27 | auVar36) ^ auVar37;
            iVar32 = auVar33._0_4_;
            bVar8 = iVar32 < auVar29._0_4_;
            iVar30 = auVar29._4_4_;
            iVar34 = auVar33._4_4_;
            if ((bool)(~(iVar34 < iVar30 || iVar30 == iVar34 && bVar8) & 1)) {
              pfVar23[uVar12 - 3] = fVar26;
            }
            if (iVar34 >= iVar30 && (iVar30 != iVar34 || !bVar8)) {
              pfVar23[uVar12 - 2] = fVar26;
            }
            auVar29 = (auVar27 | auVar35) ^ auVar37;
            iVar30 = auVar29._4_4_;
            if (iVar30 <= iVar34 && (iVar30 != iVar34 || auVar29._0_4_ <= iVar32)) {
              pfVar23[uVar12 - 1] = fVar26;
              pfVar23[uVar12] = fVar26;
            }
            uVar12 = uVar12 + 4;
          } while ((uVar9 + 3 & 0xfffffffc) != uVar12);
        }
        if (0 < (int)uVar2) {
          uVar12 = 0;
          pfVar14 = pfVar18;
          do {
            if (0 < kernel_w) {
              fVar26 = *(float *)((long)pvVar6 + uVar12 * 4 + (long)iVar10 * sVar5 * local_148);
              uVar17 = 0;
              pfVar16 = pfVar14;
              do {
                *pfVar16 = *(float *)((long)pvVar15 + uVar17 * 4) * fVar26 + *pfVar16;
                uVar17 = uVar17 + 1;
                pfVar16 = pfVar16 + dilation_w;
              } while ((uint)kernel_w != uVar17);
            }
            uVar12 = uVar12 + 1;
            pfVar14 = pfVar14 + stride_w;
          } while (uVar12 != uVar2);
        }
        if (0 < (int)uVar3) {
          pfVar14 = (float *)activation_params->data;
          uVar12 = 0;
          do {
            fVar26 = pfVar18[uVar12];
            fVar25 = fVar26;
            switch(activation_type) {
            case 1:
              if (fVar26 <= 0.0) {
                fVar25 = 0.0;
              }
              break;
            case 2:
              fVar25 = (float)(~-(uint)(0.0 < fVar26) & (uint)*pfVar14 |
                              -(uint)(0.0 < fVar26) & 0x3f800000) * fVar26;
              break;
            case 3:
              if (fVar26 <= *pfVar14) {
                fVar26 = *pfVar14;
              }
              fVar25 = pfVar14[1];
              if (fVar26 <= pfVar14[1]) {
                fVar25 = fVar26;
              }
              break;
            case 4:
              if (88.37626 <= fVar26) {
                fVar26 = 88.37626;
              }
              fVar26 = expf((float)(-(uint)(fVar26 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar26 < -88.37626) & ((uint)fVar26 ^ auVar37._0_4_)));
              auVar35 = _DAT_005f2a10;
              auVar36 = _DAT_005ef040;
              auVar37 = _DAT_005ef050;
              fVar25 = 1.0 / (fVar26 + 1.0);
              break;
            case 5:
              fVar25 = expf(fVar26);
              fVar25 = logf(fVar25 + 1.0);
              fVar25 = tanhf(fVar25);
              auVar35 = _DAT_005f2a10;
              auVar36 = _DAT_005ef040;
              auVar37 = _DAT_005ef050;
              fVar25 = fVar25 * fVar26;
              break;
            case 6:
              fVar1 = *pfVar14;
              fVar31 = (float)((uint)pfVar14[1] ^ auVar37._0_4_) / fVar1;
              fVar25 = 0.0;
              if ((fVar31 <= fVar26) && (fVar25 = fVar26, fVar26 <= fVar31 + 1.0 / fVar1)) {
                fVar25 = (fVar1 * fVar26 + pfVar14[1]) * fVar26;
              }
            }
            pfVar18[uVar12] = fVar25;
            uVar12 = uVar12 + 1;
          } while (uVar3 != uVar12);
        }
        local_148 = local_148 + 1;
        pfVar23 = (float *)((long)pfVar23 + local_110);
        pfVar18 = (float *)((long)pfVar18 + local_110);
        pvVar15 = (void *)((long)pvVar15 + (long)kernel_w * 4);
      } while (local_148 != (uint)group);
    }
  }
  else {
    uVar9 = (int)uVar9 / group;
    uVar12 = (long)top_blob->h / (long)group;
    local_110 = uVar12 & 0xffffffff;
    iVar10 = (int)uVar12;
    if (0 < group) {
      uVar4 = top_blob->w;
      local_98 = (float *)top_blob->data;
      pvVar6 = weight_data->data;
      lVar11 = (ulong)uVar4 - 1;
      auVar29._8_4_ = (int)lVar11;
      auVar29._0_8_ = lVar11;
      auVar29._12_4_ = (int)((ulong)lVar11 >> 0x20);
      lVar11 = (long)(int)uVar4 * top_blob->elemsize;
      lVar21 = lVar11 * iVar10;
      auVar29 = auVar29 ^ _DAT_005ef050;
      local_a0 = local_98 + 3;
      local_110 = 0;
      local_118 = 0;
      auVar35 = _DAT_005f2a10;
      auVar36 = _DAT_005ef040;
      auVar37 = _DAT_005ef050;
      do {
        if (0 < iVar10) {
          local_c8 = (void *)((long)pvVar6 + (long)(int)local_110 * 4);
          pvVar15 = bias_data->data;
          uVar17 = 0;
          pfVar23 = local_a0;
          pfVar18 = local_98;
          do {
            fVar26 = 0.0;
            if (!bVar24) {
              fVar26 = *(float *)((long)pvVar15 + (local_118 * (long)iVar10 + uVar17) * 4);
            }
            if (0 < (int)uVar4) {
              uVar13 = 0;
              do {
                auVar28._8_4_ = (int)uVar13;
                auVar28._0_8_ = uVar13;
                auVar28._12_4_ = (int)(uVar13 >> 0x20);
                auVar33 = (auVar28 | auVar36) ^ auVar37;
                iVar32 = auVar29._0_4_;
                bVar8 = iVar32 < auVar33._0_4_;
                iVar30 = auVar33._4_4_;
                iVar34 = auVar29._4_4_;
                if ((bool)(~(iVar34 < iVar30 || iVar30 == iVar34 && bVar8) & 1)) {
                  pfVar23[uVar13 - 3] = fVar26;
                }
                if (iVar34 >= iVar30 && (iVar30 != iVar34 || !bVar8)) {
                  pfVar23[uVar13 - 2] = fVar26;
                }
                auVar28 = (auVar28 | auVar35) ^ auVar37;
                iVar30 = auVar28._4_4_;
                if (iVar30 <= iVar34 && (iVar30 != iVar34 || auVar28._0_4_ <= iVar32)) {
                  pfVar23[uVar13 - 1] = fVar26;
                  pfVar23[uVar13] = fVar26;
                }
                uVar13 = uVar13 + 4;
              } while ((uVar4 + 3 & 0xfffffffc) != uVar13);
            }
            if (0 < (int)uVar2) {
              pvVar7 = bottom_blob->data;
              iVar30 = bottom_blob->w;
              sVar5 = bottom_blob->elemsize;
              uVar13 = 0;
              pfVar14 = pfVar18;
              do {
                if (0 < (int)uVar9) {
                  uVar20 = 0;
                  pvVar19 = local_c8;
                  do {
                    if (0 < kernel_w) {
                      fVar26 = *(float *)((long)pvVar7 +
                                         (uVar20 + uVar9 * (int)local_118) * (long)iVar30 * sVar5 +
                                         uVar13 * 4);
                      uVar22 = 0;
                      pfVar16 = pfVar14;
                      do {
                        *pfVar16 = *(float *)((long)pvVar19 + uVar22 * 4) * fVar26 + *pfVar16;
                        uVar22 = uVar22 + 1;
                        pfVar16 = pfVar16 + dilation_w;
                      } while ((uint)kernel_w != uVar22);
                    }
                    uVar20 = uVar20 + 1;
                    pvVar19 = (void *)((long)pvVar19 + (long)kernel_w * 4);
                  } while (uVar20 != uVar9);
                }
                uVar13 = uVar13 + 1;
                pfVar14 = pfVar14 + stride_w;
              } while (uVar13 != uVar2);
            }
            if (0 < (int)uVar3) {
              pfVar14 = (float *)activation_params->data;
              uVar13 = 0;
              do {
                fVar26 = pfVar18[uVar13];
                fVar25 = fVar26;
                switch(activation_type) {
                case 1:
                  if (fVar26 <= 0.0) {
                    fVar25 = 0.0;
                  }
                  break;
                case 2:
                  fVar25 = (float)(~-(uint)(0.0 < fVar26) & (uint)*pfVar14 |
                                  -(uint)(0.0 < fVar26) & 0x3f800000) * fVar26;
                  break;
                case 3:
                  if (fVar26 <= *pfVar14) {
                    fVar26 = *pfVar14;
                  }
                  fVar25 = pfVar14[1];
                  if (fVar26 <= pfVar14[1]) {
                    fVar25 = fVar26;
                  }
                  break;
                case 4:
                  if (88.37626 <= fVar26) {
                    fVar26 = 88.37626;
                  }
                  fVar26 = expf((float)(-(uint)(fVar26 < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(fVar26 < -88.37626) & ((uint)fVar26 ^ auVar37._0_4_)
                                       ));
                  auVar35 = _DAT_005f2a10;
                  auVar36 = _DAT_005ef040;
                  auVar37 = _DAT_005ef050;
                  fVar25 = 1.0 / (fVar26 + 1.0);
                  break;
                case 5:
                  fVar25 = expf(fVar26);
                  fVar25 = logf(fVar25 + 1.0);
                  fVar25 = tanhf(fVar25);
                  auVar35 = _DAT_005f2a10;
                  auVar36 = _DAT_005ef040;
                  auVar37 = _DAT_005ef050;
                  fVar25 = fVar25 * fVar26;
                  break;
                case 6:
                  fVar1 = *pfVar14;
                  fVar31 = (float)((uint)pfVar14[1] ^ auVar37._0_4_) / fVar1;
                  fVar25 = 0.0;
                  if ((fVar31 <= fVar26) && (fVar25 = fVar26, fVar26 <= fVar31 + 1.0 / fVar1)) {
                    fVar25 = (fVar1 * fVar26 + pfVar14[1]) * fVar26;
                  }
                }
                pfVar18[uVar13] = fVar25;
                uVar13 = uVar13 + 1;
              } while (uVar3 != uVar13);
            }
            uVar17 = uVar17 + 1;
            pfVar23 = (float *)((long)pfVar23 + lVar11);
            pfVar18 = (float *)((long)pfVar18 + lVar11);
            local_c8 = (void *)((long)local_c8 + (long)(int)(uVar9 * kernel_w) * 4);
          } while (uVar17 != (uVar12 & 0xffffffff));
        }
        local_118 = local_118 + 1;
        local_a0 = (float *)((long)local_a0 + lVar21);
        local_98 = (float *)((long)local_98 + lVar21);
        local_110 = (ulong)((int)local_110 + uVar9 * kernel_w * iVar10);
      } while (local_118 != (uint)group);
    }
  }
  return (int)local_110;
}

Assistant:

static int deconvolutiondepthwise1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    // depth-wise
    if (h == group && group == outh)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat out = top_blob.row_range(g, 1);

            const float* inptr = bottom_blob.row(g);
            const float* kptr = (const float*)weight_data + kernel_w * g;

            const float bias = bias_term ? bias_data[g] : 0.f;

            out.fill(bias);

            for (int j = 0; j < w; j++)
            {
                float* outptr = (float*)out + j * stride_w;

                const float val = inptr[j];

                for (int k = 0; k < kernel_w; k++)
                {
                    float w = kptr[k];
                    outptr[k * dilation_w] += val * w;
                }
            }

            {
                float* outptr = out;

                for (int i = 0; i < outw; i++)
                {
                    outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                }
            }
        }
    }
    else
    {
        const int h_g = h / group;
        const int outh_g = outh / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outh_g; p++)
            {
                Mat out = top_blob.row_range(g * outh_g + p, 1);

                const float* weight_data_ptr = (const float*)weight_data + kernel_w * h_g * outh_g * g;
                const float bias = bias_term ? bias_data[g * outh_g + p] : 0.f;

                out.fill(bias);

                for (int j = 0; j < w; j++)
                {
                    float* outptr = (float*)out + j * stride_w;

                    const float* kptr = weight_data_ptr + kernel_w * h_g * p;

                    for (int q = 0; q < h_g; q++)
                    {
                        const float val = bottom_blob.row(h_g * g + q)[j];

                        for (int k = 0; k < kernel_w; k++)
                        {
                            outptr[k * dilation_w] += val * kptr[k];
                        }

                        kptr += kernel_w;
                    }
                }

                {
                    float* outptr = out;

                    for (int i = 0; i < outw; i++)
                    {
                        outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                    }
                }
            }
        }
    }

    return 0;
}